

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O1

pos_type __thiscall
avro::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode param_3)

{
  long lVar1;
  element_type *peVar2;
  _Elt_pointer pCVar3;
  _Map_pointer ppCVar4;
  data_type *pdVar5;
  data_type *pdVar6;
  _Elt_pointer pCVar7;
  _Elt_pointer pCVar8;
  ulong uVar9;
  long lVar10;
  pos_type pVar11;
  
  lVar1 = this->basePos_;
  uVar9 = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8) + lVar1;
  if (dir == _S_end) {
    off = off + ((this->buffer_).pimpl_.px)->size_;
  }
  else if (dir == _S_cur) {
    off = off + uVar9;
  }
  if ((off != uVar9) &&
     ((lVar10 = (*(long *)&this->field_0x18 - *(long *)&this->field_0x8) + lVar1, off <= lVar10 ||
      (uVar9 = 0xffffffffffffffff, off <= (long)((this->buffer_).pimpl_.px)->size_)))) {
    if (off < lVar1) {
      peVar2 = (this->buffer_).pimpl_.px;
      pCVar3 = (peVar2->readChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      ppCVar4 = *(_Map_pointer *)
                 ((long)&(peVar2->readChunks_).
                         super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                         ._M_impl.super__Deque_impl_data._M_start + 0x18);
      pCVar7 = *(_Elt_pointer *)
                ((long)&(peVar2->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 8);
      pCVar8 = *(_Elt_pointer *)
                ((long)&(peVar2->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 0x10);
      (this->iter_).helper_.iter_._M_cur = pCVar3;
      (this->iter_).helper_.iter_._M_first = pCVar7;
      (this->iter_).helper_.iter_._M_last = pCVar8;
      (this->iter_).helper_.iter_._M_node = ppCVar4;
      this->basePos_ = 0;
      if (pCVar3 == (peVar2->readChunks_).
                    super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur) {
        *(undefined8 *)&this->field_0x8 = 0;
        *(undefined8 *)&this->field_0x10 = 0;
        *(undefined8 *)&this->field_0x18 = 0;
      }
      else {
        pdVar5 = pCVar3->readPos_;
        pdVar6 = pCVar3->writePos_;
        *(data_type **)&this->field_0x8 = pdVar5;
        *(data_type **)&this->field_0x10 = pdVar5;
        *(data_type **)&this->field_0x18 = pdVar6;
      }
      lVar10 = *(long *)&this->field_0x18 - *(long *)&this->field_0x8;
    }
    while (lVar10 < off) {
      underflow(this);
      lVar10 = (this->basePos_ + *(long *)&this->field_0x18) - *(long *)&this->field_0x8;
    }
    *(off_type *)&this->field_0x10 = (off - this->basePos_) + *(long *)&this->field_0x8;
    uVar9 = off;
  }
  pVar11._M_state.__count = 0;
  pVar11._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  pVar11._M_off = uVar9;
  return pVar11;
}

Assistant:

virtual pos_type seekoff(off_type off, std::ios::seekdir dir, std::ios_base::openmode) {

        off_type curpos = basePos_ + (gptr() - eback()); 
        off_type newpos = off;

        if(dir == std::ios::cur) {
            newpos += curpos;
        }
        else if (dir == std::ios::end) {
            newpos += buffer_.size();
        }
        // short circuit for tell()  
        if(newpos == curpos) {
            return curpos;
        }

        off_type endpos = basePos_ + (egptr() - eback());

        // if the position is after our current buffer make
        // sure it's not past the end of the buffer
        if((newpos > endpos) && (newpos > static_cast<off_type>(buffer_.size()) )) {
            return pos_type(-1);
        }
        // if the new position is before our current iterator
        // reset the iterator to the beginning
        else if (newpos < basePos_) {
            iter_ = buffer_.begin();
            basePos_ = 0;
            setBuffer();
            endpos = (egptr() -eback());
        }

        // now if the new position is after the end of the buffer
        // increase the buffer until it is not
        while (newpos > endpos) {
            istreambuf::underflow();
            endpos = basePos_ + (egptr() - eback()); 
        }

        setg(eback(), eback() + (newpos - basePos_), egptr());
        return newpos;
    }